

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-accesses.cpp
# Opt level: O0

size_t test_memory(vector<int_*,_std::allocator<int_*>_> *memory)

{
  const_reference ppiVar1;
  rep rVar2;
  ostream *this;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000000L>_> local_40;
  duration local_38;
  size_t j;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_28;
  int i;
  time_point start;
  size_t size;
  size_t sum;
  vector<int_*,_std::allocator<int_*>_> *memory_local;
  
  size = 0;
  start.__d.__r = (duration)std::vector<int_*,_std::allocator<int_*>_>::size(memory);
  tStack_28.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (j._4_4_ = 0; j._4_4_ < 0x32; j._4_4_ = j._4_4_ + 1) {
    for (local_38.__r = 0; (ulong)local_38.__r < (ulong)start.__d.__r;
        local_38.__r = local_38.__r + 1) {
      ppiVar1 = std::vector<int_*,_std::allocator<int_*>_>::operator[](memory,local_38.__r);
      size = (long)**ppiVar1 + size;
    }
  }
  local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_48.__r = (rep)std::chrono::operator-(&local_50,&stack0xffffffffffffffd8);
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_48);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_40);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,rVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return size;
}

Assistant:

size_t test_memory(const std::vector<Type*>& memory)
{
    size_t sum = 0;
    size_t size = memory.size();

    using Clock = std::chrono::steady_clock;
    auto start = Clock::now();

    for (int i = 0; i < REPETITIONS; i++)
    {
        for (size_t j = 0; j < size; j++)
        {
            sum += *memory[j];
        }
    }

    std::cerr << std::chrono::duration_cast<std::chrono::microseconds>(Clock::now() - start).count() << std::endl;
    return sum;
}